

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O1

void mempool_align(void)

{
  int iVar1;
  byte order;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  void *pvVar5;
  long lVar6;
  mslab *slab;
  void *pvStack_138;
  void *ptr [32];
  
  plan(1);
  _space(_stdout);
  printf("# *** %s ***\n","mempool_align");
  pvVar5 = (void *)0x8;
  do {
    pvVar3 = (void *)0x70;
    if (0x70 < (uint)pvVar5) {
      pvVar3 = pvVar5;
    }
    uVar4 = (ulong)((double)(long)pvVar3 / 0.01);
    uVar4 = (long)((double)(long)pvVar3 / 0.01 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f |
            uVar4;
    if ((cache.arena)->slab_size <= uVar4) {
      uVar4 = (ulong)(cache.arena)->slab_size;
    }
    if (cache.order0_size < uVar4) {
      uVar2 = (int)uVar4 - 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      order = 0x20 - (((byte)iVar1 ^ 0x1f) + cache.order0_size_lb);
    }
    else {
      order = 0;
    }
    if (cache.order_max < order) {
      __assert_fail("order <= cache->order_max",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                    ,0xfe,"void mempool_create(struct mempool *, struct slab_cache *, uint32_t)");
    }
    mempool_create_with_order(&pool,&cache,(uint)pvVar5,order);
    lVar6 = 0;
    ptr[0x1f] = pvVar5;
    do {
      pvVar3 = mempool_alloc(&pool);
      ptr[lVar6 + -1] = pvVar3;
      if (((long)pvVar5 - 1U & (ulong)pvVar3) != 0) {
        mempool_align_cold_1();
        goto LAB_00102bde;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x20);
    lVar6 = 0;
    do {
      pvVar5 = ptr[lVar6 + -1];
      if (pvVar5 == (void *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                      ,0x136,"void mempool_free(struct mempool *, void *)");
      }
      slab = (mslab *)(pool.slab_ptr_mask & (ulong)pvVar5);
      if ((slab->slab).magic != 0xeec0ffee) {
        __assert_fail("slab->magic == slab_magic",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/slab_cache.h"
                      ,0xd1,"struct slab *slab_from_ptr(void *, intptr_t)");
      }
      memset(pvVar5,0x23,(ulong)pool.objsize);
      if ((slab->slab).order != pool.slab_order) {
LAB_00102bde:
        __assert_fail("slab->slab.order == pool->slab_order",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                      ,0x12a,"void mempool_free_slab(struct mempool *, struct mslab *, void *)");
      }
      pool.slabs.stats.used = pool.slabs.stats.used - pool.objsize;
      mslab_free(&pool,slab,pvVar5);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x20);
    mempool_destroy(&pool);
    pvVar5 = (void *)(ulong)((uint)ptr[0x1f] * 2);
    if (0x7ff < (uint)ptr[0x1f]) {
      _ok(1,"true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/mempool.c",0x76,
          "line %d",0x76);
      _space(_stdout);
      printf("# *** %s: done ***\n","mempool_align");
      check_plan();
      return;
    }
  } while( true );
}

Assistant:

void
mempool_align()
{
	plan(1);
	header();

	for (uint32_t size = OBJSIZE_MIN; size < OBJSIZE_MAX; size <<= 1) {
		mempool_create(&pool, &cache, size);
		void *ptr[32];
		for (int i = 0; i < (int)lengthof(ptr); i++) {
			ptr[i] = mempool_alloc(&pool);
			uintptr_t addr = (uintptr_t)ptr[i];
			if (addr % size)
				fail("aligment", "wrong");
		}
		for (int i = 0; i < (int)lengthof(ptr); i++)
			mempool_free(&pool, ptr[i]);
		mempool_destroy(&pool);
	}
	ok(true);

	footer();
	check_plan();
}